

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

void __thiscall
pstore::transaction_base::transaction_base(transaction_base *this,transaction_base *rhs)

{
  bool bVar1;
  address aVar2;
  transaction_base *rhs_local;
  transaction_base *this_local;
  
  this->_vptr_transaction_base = (_func_int **)&PTR__transaction_base_001ba760;
  this->db_ = rhs->db_;
  this->size_ = rhs->size_;
  this->dbsize_ = rhs->dbsize_;
  (this->first_).a_ = (rhs->first_).a_;
  aVar2 = address::null();
  (rhs->first_).a_ = aVar2.a_;
  bVar1 = is_open(rhs);
  if (!bVar1) {
    return;
  }
  assert_failed("!rhs.is_open ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/transaction.cpp"
                ,0x2f);
}

Assistant:

transaction_base::transaction_base (transaction_base && rhs) noexcept
            : db_{rhs.db_}
            , size_{rhs.size_}
            , dbsize_{rhs.dbsize_}
            , first_ (rhs.first_) {
        rhs.first_ = address::null ();

        PSTORE_ASSERT (!rhs.is_open ()); //! OCLINT(PH - don't warn about the assert macro)
    }